

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg.h
# Opt level: O0

bool __thiscall svg::Document::save(Document *this)

{
  byte bVar1;
  char *pcVar2;
  bool bVar3;
  undefined1 local_248 [56];
  ofstream ofs;
  Document *this_local;
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_248 + 0x30,pcVar2,_S_out);
  bVar1 = std::ios::good();
  bVar3 = (bVar1 & 1) != 0;
  if (bVar3) {
    toString_abi_cxx11_((Document *)local_248);
    std::operator<<((ostream *)(local_248 + 0x30),(string *)local_248);
    std::__cxx11::string::~string((string *)local_248);
    std::ofstream::close();
  }
  local_248._32_4_ = 1;
  std::ofstream::~ofstream(local_248 + 0x30);
  return bVar3;
}

Assistant:

bool save() const
        {
            std::ofstream ofs(file_name.c_str());
            if (!ofs.good())
                return false;

            ofs << toString();
            ofs.close();
            return true;
        }